

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::FiberStack::runOne(FiberStack *this)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  FunctionParam<void_()> *in_RDX;
  Exception *exception;
  Exception local_358;
  Maybe<kj::Exception> local_1c8;
  
  uVar1 = (this->main).tag;
  if (uVar1 == 2) {
    runCatchingExceptions<kj::FunctionParam<void()>&>
              (&local_1c8,*(kj **)(this->main).field_1,in_RDX);
    uVar9 = local_1c8.ptr.field_1.value.remoteTrace.content.size_;
    uVar8 = local_1c8.ptr.field_1.value.remoteTrace.content.ptr;
    uVar7 = local_1c8.ptr.field_1.value.context.ptr.ptr;
    uVar6 = local_1c8.ptr.field_1.value.description.content.size_;
    uVar5 = local_1c8.ptr.field_1.value.description.content.ptr;
    uVar4 = local_1c8.ptr.field_1.value.ownFile.content.size_;
    uVar3 = local_1c8.ptr.field_1.value.ownFile.content.ptr;
    if (local_1c8.ptr.isSet == true) {
      local_358.ownFile.content.ptr = local_1c8.ptr.field_1.value.ownFile.content.ptr;
      local_358.ownFile.content.size_ = local_1c8.ptr.field_1.value.ownFile.content.size_;
      local_358.ownFile.content.disposer = local_1c8.ptr.field_1.value.ownFile.content.disposer;
      local_1c8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      local_1c8.ptr.field_1.value.ownFile.content.size_ = 0;
      local_358.file = local_1c8.ptr.field_1.value.file;
      local_358.line = local_1c8.ptr.field_1.value.line;
      local_358.type = local_1c8.ptr.field_1.value.type;
      local_358.description.content.ptr = local_1c8.ptr.field_1.value.description.content.ptr;
      local_358.description.content.size_ = local_1c8.ptr.field_1.value.description.content.size_;
      local_358.description.content.disposer =
           local_1c8.ptr.field_1.value.description.content.disposer;
      local_1c8.ptr.field_1.value.description.content.ptr = (char *)0x0;
      local_1c8.ptr.field_1.value.description.content.size_ = 0;
      local_358.context.ptr.disposer = local_1c8.ptr.field_1.value.context.ptr.disposer;
      local_1c8.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      local_358.remoteTrace.content.ptr = local_1c8.ptr.field_1.value.remoteTrace.content.ptr;
      local_358.remoteTrace.content.disposer =
           local_1c8.ptr.field_1.value.remoteTrace.content.disposer;
      local_1c8.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
      local_1c8.ptr.field_1.value.remoteTrace.content.size_ = 0;
      memcpy(local_358.trace,(void *)((long)&local_1c8.ptr.field_1 + 0x68),0x105);
      uVar12 = local_1c8.ptr.field_1.value.details.builder.endPtr;
      uVar11 = local_1c8.ptr.field_1.value.details.builder.pos;
      uVar10 = local_1c8.ptr.field_1.value.details.builder.ptr;
      local_358.details.builder.disposer = local_1c8.ptr.field_1.value.details.builder.disposer;
      local_1c8.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
      local_1c8.ptr.field_1.value.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
      local_1c8.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
      Exception::~Exception(&local_1c8.ptr.field_1.value);
      lVar2 = *(long *)(this->main).field_1.space;
      if (*(char *)(lVar2 + 8) == '\x01') {
        *(undefined1 *)(lVar2 + 8) = 0;
        Exception::~Exception((Exception *)(lVar2 + 0x10));
      }
      *(undefined8 *)(lVar2 + 0x10) = uVar3;
      *(undefined8 *)(lVar2 + 0x18) = uVar4;
      *(ArrayDisposer **)(lVar2 + 0x20) = local_1c8.ptr.field_1.value.ownFile.content.disposer;
      local_358.ownFile.content.ptr = (char *)0x0;
      local_358.ownFile.content.size_ = 0;
      *(char **)(lVar2 + 0x28) = local_358.file;
      *(undefined8 *)(lVar2 + 0x30) = local_358._32_8_;
      *(undefined8 *)(lVar2 + 0x38) = uVar5;
      *(undefined8 *)(lVar2 + 0x40) = uVar6;
      *(ArrayDisposer **)(lVar2 + 0x48) = local_1c8.ptr.field_1.value.description.content.disposer;
      local_358.description.content.ptr = (char *)0x0;
      local_358.description.content.size_ = 0;
      *(Disposer **)(lVar2 + 0x50) = local_1c8.ptr.field_1.value.context.ptr.disposer;
      *(undefined8 *)(lVar2 + 0x58) = uVar7;
      local_358.context.ptr.ptr = (Context *)0x0;
      *(undefined8 *)(lVar2 + 0x60) = uVar8;
      *(undefined8 *)(lVar2 + 0x68) = uVar9;
      *(ArrayDisposer **)(lVar2 + 0x70) = local_1c8.ptr.field_1.value.remoteTrace.content.disposer;
      local_358.remoteTrace.content.ptr = (char *)0x0;
      local_358.remoteTrace.content.size_ = 0;
      memcpy((void *)(lVar2 + 0x78),local_358.trace,0x105);
      *(undefined8 *)(lVar2 + 0x180) = uVar10;
      *(undefined8 *)(lVar2 + 0x188) = uVar11;
      *(undefined8 *)(lVar2 + 400) = uVar12;
      *(ArrayDisposer **)(lVar2 + 0x198) = local_1c8.ptr.field_1.value.details.builder.disposer;
      local_358.details.builder.ptr = (Detail *)0x0;
      local_358.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
      local_358.details.builder.endPtr = (Detail *)0x0;
      *(undefined1 *)(lVar2 + 8) = 1;
      Exception::~Exception(&local_358);
    }
  }
  else if (uVar1 == 1) {
    FiberBase::run((FiberBase *)(this->main).field_1);
    return;
  }
  return;
}

Assistant:

void FiberStack::runOne() {
  KJ_SWITCH_ONEOF(main) {
    KJ_CASE_ONEOF(event, FiberBase*) {
      event->run();
    }
    KJ_CASE_ONEOF(func, SynchronousFunc*) {
      KJ_IF_SOME(exception, kj::runCatchingExceptions(func->func)) {
        func->exception.emplace(kj::mv(exception));
      }
    }
  }
}